

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_randomness(int N,void *pBuf)

{
  int iVar1;
  sqlite3_mutex *in;
  sqlite3_vfs *zBufOut;
  sqlite3_vfs *in_RSI;
  int in_EDI;
  sqlite3_vfs *pVfs;
  sqlite3_mutex *mutex;
  uchar *zBuf;
  undefined8 in_stack_ffffffffffffffd8;
  int id;
  sqlite3_vfs *pVfs_00;
  int local_4;
  
  id = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pVfs_00 = in_RSI;
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    in = sqlite3MutexAlloc(id);
    sqlite3_mutex_enter((sqlite3_mutex *)0x138162);
    if ((in_EDI < 1) || (in_RSI == (sqlite3_vfs *)0x0)) {
      sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
      sqlite3_mutex_leave((sqlite3_mutex *)0x138185);
    }
    else {
      local_4 = in_EDI;
      if (sqlite3Prng.s[0] == 0) {
        zBufOut = sqlite3_vfs_find((char *)pVfs_00);
        sqlite3Prng.s[0] = 0x61707865;
        sqlite3Prng.s[1] = 0x3320646e;
        sqlite3Prng.s[2] = 0x79622d32;
        sqlite3Prng.s[3] = 0x6b206574;
        if (zBufOut == (sqlite3_vfs *)0x0) {
          memset(sqlite3Prng.s + 4,0,0x2c);
        }
        else {
          sqlite3OsRandomness(pVfs_00,(int)((ulong)in >> 0x20),(char *)zBufOut);
        }
        sqlite3Prng.s[0xf] = sqlite3Prng.s[0xc];
        sqlite3Prng.s[0xc] = 0;
        sqlite3Prng.n = '\0';
      }
      while ((int)(uint)sqlite3Prng.n < local_4) {
        if (sqlite3Prng.n != '\0') {
          memcpy(pVfs_00,sqlite3Prng.out,(ulong)sqlite3Prng.n);
          local_4 = local_4 - (uint)sqlite3Prng.n;
          pVfs_00 = (sqlite3_vfs *)((long)&pVfs_00->iVersion + (long)(int)(uint)sqlite3Prng.n);
        }
        sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
        chacha_block((u32 *)pVfs_00,(u32 *)in);
        sqlite3Prng.n = '@';
      }
      memcpy(pVfs_00,sqlite3Prng.out + (int)((uint)sqlite3Prng.n - local_4),(long)local_4);
      sqlite3Prng.n = sqlite3Prng.n - (char)local_4;
      sqlite3_mutex_leave((sqlite3_mutex *)0x1382ef);
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}